

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format_decode_data_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::anon_unknown_0::
ObjCHelper_TextFormatDecodeData_RawStrings_Test::~ObjCHelper_TextFormatDecodeData_RawStrings_Test
          (ObjCHelper_TextFormatDecodeData_RawStrings_Test *this)

{
  ObjCHelper_TextFormatDecodeData_RawStrings_Test *this_local;
  
  ~ObjCHelper_TextFormatDecodeData_RawStrings_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ObjCHelper, TextFormatDecodeData_RawStrings) {
  TextFormatDecodeData decode_data;

  // Different data, can't transform.
  decode_data.AddString(1, "abcdefghIJ", "zbcdefghIJ");
  decode_data.AddString(3, "abcdefghIJ", "abcdezghIJ");
  // Shortened data, can't transform.
  decode_data.AddString(2, "abcdefghIJ", "abcdefghI");
  // Extra data, can't transform.
  decode_data.AddString(4, "abcdefghIJ", "abcdefghIJz");

  EXPECT_EQ(4, decode_data.num_entries());

  uint8_t expected_data[] = {
      // clang-format off
      0x4,
      0x1, 0x0, 'z', 'b', 'c', 'd', 'e', 'f', 'g', 'h', 'I', 'J', 0x0,
      0x3, 0x0, 'a', 'b', 'c', 'd', 'e', 'z', 'g', 'h', 'I', 'J', 0x0,
      0x2, 0x0, 'a', 'b', 'c', 'd', 'e', 'f', 'g', 'h', 'I', 0x0,
      0x4, 0x0, 'a', 'b', 'c', 'd', 'e', 'f', 'g', 'h', 'I', 'J', 'z', 0x0,
      // clang-format on
  };
  std::string expected((const char*)expected_data, sizeof(expected_data));

  EXPECT_EQ(expected, decode_data.Data());
}